

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O0

Oop __thiscall Lodtalk::Behavior::lookupSelector(Behavior *this,Oop selector)

{
  bool bVar1;
  Oop method;
  Behavior *this_local;
  Oop selector_local;
  
  bVar1 = isNil((ProtoObject *)this->methodDict);
  if (bVar1) {
    selector_local = nilOop();
  }
  else {
    selector_local = MethodDictionary::atOrNil(this->methodDict,selector);
    bVar1 = isNil(selector_local);
    if (bVar1) {
      bVar1 = isNil((ProtoObject *)this->superclass);
      if (bVar1) {
        selector_local = nilOop();
      }
      else {
        selector_local = lookupSelector(this->superclass,selector);
      }
    }
  }
  return (Oop)selector_local.field_0.pointer;
}

Assistant:

Oop Behavior::lookupSelector(Oop selector)
{
	// Sanity check.
	if(isNil(methodDict))
		return nilOop();

	// Look the method in the dictionary.
	auto method = methodDict->atOrNil(selector);
	if(!isNil(method))
		return method;

	// Find in the super class.
	if(isNil(superclass))
		return nilOop();
	return superclass->lookupSelector(selector);
}